

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringBuffer.cc
# Opt level: O0

void __thiscall Vector::appendValue(Vector *this,long l)

{
  long lVar1;
  void *pvVar2;
  undefined8 in_RSI;
  long *in_RDI;
  long addThis;
  ulong local_18;
  
  if (in_RDI[1] == in_RDI[2]) {
    local_18 = (ulong)in_RDI[2] >> 3;
    if ((long)local_18 < vDefaultBoost) {
      local_18 = vDefaultBoost;
    }
    in_RDI[2] = local_18 + in_RDI[2];
    pvVar2 = realloc((void *)*in_RDI,in_RDI[2] << 3);
    *in_RDI = (long)pvVar2;
  }
  lVar1 = in_RDI[1];
  in_RDI[1] = lVar1 + 1;
  *(undefined8 *)(*in_RDI + lVar1 * 8) = in_RSI;
  return;
}

Assistant:

void Vector::appendValue(const long l) {
  long addThis;
  if (vLength == vaLength) {
    addThis = vaLength / 8;
    if (Vector::vDefaultBoost > addThis)
      addThis = Vector::vDefaultBoost;
    vaLength += addThis;
    vData = (long *)realloc(vData, sizeof(long) * vaLength);
  }
  vData[vLength++] = l;
}